

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O0

void __thiscall
tchecker::algorithms::covreach::
algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t>::expand_next_nodes
          (algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t> *this,
          node_sptr_t *node,refzg_t *ts,graph_t *graph,
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
          *next_nodes,stats_t *stats)

{
  bool bVar1;
  reference __t;
  unsigned_long *puVar2;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  local_c0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  local_b8;
  node_sptr_t local_b0;
  node_sptr_t next_node;
  type *t;
  type *s;
  type_conflict2 *status;
  __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
  local_88;
  iterator __end0;
  iterator __begin0;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *__range3;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  local_58;
  node_sptr_t covering_node;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  sst;
  stats_t *stats_local;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
  *next_nodes_local;
  graph_t *graph_local;
  refzg_t *ts_local;
  node_sptr_t *node_local;
  algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t> *this_local;
  
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::vector((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
            *)&covering_node);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            (&local_58,
             (make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
              *)0x0);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::operator->(node);
  tchecker::graph::node_refzg_state_t::state_ptr((node_refzg_state_t *)&__range3);
  refzg::refzg_t::next
            (ts,(const_state_sptr_t *)&__range3,
             (vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
              *)&covering_node,1);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
              *)&__range3);
  __end0 = std::
           vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
           ::begin((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                    *)&covering_node);
  local_88._M_current =
       (tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>
        *)std::
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
          ::end((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                 *)&covering_node);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&local_88);
    if (!bVar1) break;
    __t = __gnu_cxx::
          __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
          ::operator*(&__end0);
    std::
    get<0ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>>>
              (__t);
    std::
    get<1ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>>>
              (__t);
    next_node._t = (make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
                    *)std::
                      get<2ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>>>
                                (__t);
    puVar2 = stats_t::visited_transitions(stats);
    *puVar2 = *puVar2 + 1;
    tchecker::graph::subsumption::
    graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
    ::
    add_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>>&>
              ((graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
                *)&local_b0,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
                *)graph);
    bVar1 = tchecker::graph::subsumption::
            graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
            ::is_covered(&graph->
                          super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
                         ,&local_b0,&local_58);
    if (bVar1) {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
      ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
                   *)next_node._t);
      tchecker::graph::subsumption::
      graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
      ::add_edge<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>&>
                ((graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
                  *)&local_b8,(node_sptr_t *)graph,node,(edge_type_t)&local_58,
                 (make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL> *)0x1);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_b8);
      tchecker::graph::subsumption::
      graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
      ::remove_node(&graph->
                     super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
                    ,&local_b0);
      puVar2 = stats_t::covered_states(stats);
      *puVar2 = *puVar2 + 1;
    }
    else {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
      ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
                   *)next_node._t);
      tchecker::graph::subsumption::
      graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
      ::add_edge<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>&>
                ((graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
                  *)&local_c0,(node_sptr_t *)graph,node,(edge_type_t)&local_b0,
                 (make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL> *)0x0);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_c0);
      std::
      vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
      ::push_back(next_nodes,&local_b0);
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_b0);
    __gnu_cxx::
    __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
    ::operator++(&__end0);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_58);
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
             *)&covering_node);
  return;
}

Assistant:

void expand_next_nodes(typename GRAPH::node_sptr_t const & node, TS & ts, GRAPH & graph,
                         std::vector<typename GRAPH::node_sptr_t> & next_nodes, tchecker::algorithms::covreach::stats_t & stats)
  {
    std::vector<typename TS::sst_t> sst;
    typename GRAPH::node_sptr_t covering_node;

    ts.next(node->state_ptr(), sst);
    for (auto && [status, s, t] : sst) {
      ++stats.visited_transitions();
      typename GRAPH::node_sptr_t next_node = graph.add_node(s);
      if (graph.is_covered(next_node, covering_node)) {
        graph.add_edge(node, covering_node, tchecker::graph::subsumption::EDGE_SUBSUMPTION, *t);
        graph.remove_node(next_node);
        ++stats.covered_states();
      }
      else {
        graph.add_edge(node, next_node, tchecker::graph::subsumption::EDGE_ACTUAL, *t);
        next_nodes.push_back(next_node);
      }
    }
  }